

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::~Dynamic_Object_Constructor
          (Dynamic_Object_Constructor *this)

{
  Dynamic_Object_Constructor *this_local;
  
  ~Dynamic_Object_Constructor(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

Dynamic_Object_Constructor(std::string t_type_name, const Proxy_Function &t_func)
            : Proxy_Function_Base(build_type_list(t_func->get_param_types()), t_func->get_arity() - 1)
            , m_type_name(std::move(t_type_name))
            , m_func(t_func) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }